

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O3

HdlcByte * __thiscall
HdlcAnalyzer::ByteAsyncProcessFlags(HdlcByte *__return_storage_ptr__,HdlcAnalyzer *this)

{
  U64 UVar1;
  undefined6 uVar2;
  bool bVar3;
  bool bVar4;
  vector<HdlcByte,_std::allocator<HdlcByte>_> readBytes;
  HdlcByte asyncByte;
  vector<HdlcByte,_std::allocator<HdlcByte>_> local_98;
  HdlcByte local_78;
  vector<HdlcByte,_std::allocator<HdlcByte>_> local_60;
  vector<HdlcByte,_std::allocator<HdlcByte>_> local_48;
  
  local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (HdlcByte *)0x0;
  local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (HdlcByte *)0x0;
  bVar3 = false;
  do {
    ReadByte(&local_78,this);
    bVar4 = local_78.value == '~';
    if (bVar4) {
      if (local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<HdlcByte,std::allocator<HdlcByte>>::_M_realloc_insert<HdlcByte_const&>
                  ((vector<HdlcByte,std::allocator<HdlcByte>> *)&local_98,
                   (iterator)
                   local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_78);
      }
      else {
        (local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
         super__Vector_impl_data._M_finish)->value = 0x7e;
        (local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
         super__Vector_impl_data._M_finish)->escaped = (bool)local_78.escaped;
        *(int6 *)&(local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
                   super__Vector_impl_data._M_finish)->field_0x12 = local_78._18_6_;
        (local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
         super__Vector_impl_data._M_finish)->startSample = local_78.startSample;
        (local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
         super__Vector_impl_data._M_finish)->endSample = local_78.endSample;
        local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    else if (bVar3) {
      if (local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<HdlcByte,std::allocator<HdlcByte>>::_M_realloc_insert<HdlcByte_const&>
                  ((vector<HdlcByte,std::allocator<HdlcByte>> *)&local_98,
                   (iterator)
                   local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_78);
      }
      else {
        (local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
         super__Vector_impl_data._M_finish)->value = local_78.value;
        (local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
         super__Vector_impl_data._M_finish)->escaped = (bool)local_78.escaped;
        *(int6 *)&(local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
                   super__Vector_impl_data._M_finish)->field_0x12 = local_78._18_6_;
        (local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
         super__Vector_impl_data._M_finish)->startSample = local_78.startSample;
        (local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
         super__Vector_impl_data._M_finish)->endSample = local_78.endSample;
        local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      std::vector<HdlcByte,_std::allocator<HdlcByte>_>::vector(&local_60,&local_98);
      GenerateFlagsFrames(this,&local_60);
      if (local_60.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar3 = local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].escaped;
      uVar2 = *(undefined6 *)
               &local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].field_0x12;
      __return_storage_ptr__->value =
           local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].value;
      __return_storage_ptr__->escaped = bVar3;
      *(undefined6 *)&__return_storage_ptr__->field_0x12 = uVar2;
      UVar1 = local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].endSample;
      __return_storage_ptr__->startSample =
           local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].startSample;
      __return_storage_ptr__->endSample = UVar1;
      goto LAB_00108c4a;
    }
    bVar3 = bVar4;
  } while (this->mAbortFrame != true);
  std::vector<HdlcByte,_std::allocator<HdlcByte>_>::vector(&local_48,&local_98);
  GenerateFlagsFrames(this,&local_48);
  if (local_48.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  __return_storage_ptr__->startSample = 0;
  __return_storage_ptr__->endSample = 0;
  __return_storage_ptr__->value = '\0';
LAB_00108c4a:
  if (local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

HdlcByte HdlcAnalyzer::ByteAsyncProcessFlags()
{
    bool flagEncountered = false;
    // Read bytes until non-flag byte
    vector<HdlcByte> readBytes;

    for( ;; )
    {
        HdlcByte asyncByte = ReadByte();
        if( ( asyncByte.value != HDLC_FLAG_VALUE ) && flagEncountered )
        {
            readBytes.push_back( asyncByte );
            break;
        }
        else if( asyncByte.value == HDLC_FLAG_VALUE )
        {
            readBytes.push_back( asyncByte );
            flagEncountered = true;
        }
        if( mAbortFrame )
        {
            GenerateFlagsFrames( readBytes );
            HdlcByte b;
            b.startSample = 0;
            b.endSample = 0;
            b.value = 0;
            return b;
        }
    }

    GenerateFlagsFrames( readBytes );

    HdlcByte nonFlagByte = readBytes.back();
    return nonFlagByte;
}